

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFetc.cpp
# Opt level: O2

void __thiscall NaPNFetcher::set_output(NaPNFetcher *this,int nDim,uint *piMap)

{
  uint *puVar1;
  undefined4 *puVar2;
  ulong uVar3;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  this->nOutDim = nDim;
  if (this->piOutMap != (uint *)0x0) {
    operator_delete__(this->piOutMap);
    nDim = this->nOutDim;
  }
  if (nDim < 0) {
    this->piOutMap = (uint *)0x0;
  }
  else {
    if (piMap == (uint *)0x0) {
      puVar2 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar2 = 0;
      __cxa_throw(puVar2,&NaException::typeinfo,0);
    }
    puVar1 = (uint *)operator_new__((ulong)(uint)nDim * 4);
    this->piOutMap = puVar1;
    for (uVar3 = 0; (uint)nDim != uVar3; uVar3 = uVar3 + 1) {
      puVar1[uVar3] = piMap[uVar3];
    }
  }
  return;
}

Assistant:

void
NaPNFetcher::set_output (int nDim, const unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete[] piOutMap;

  if(nOutDim < 0)
    piOutMap = NULL;
  else if(NULL == piMap)
    throw(na_null_pointer);
  else
    {
      int	i;
      piOutMap = new unsigned[nOutDim];
      for(i = 0; i < nOutDim; ++i)
	piOutMap[i] = piMap[i];
    }
}